

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

void __thiscall
Lodtalk::AST::MessageSendNode::MessageSendNode
          (MessageSendNode *this,string *selector,Node *receiver,Node *firstArgument)

{
  Node *local_28;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__MessageSendNode_0016fee8;
  local_28 = firstArgument;
  std::__cxx11::string::string((string *)&this->selector,(string *)selector);
  this->receiver = receiver;
  (this->arguments).super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arguments).super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arguments).super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->chainedMessages).
  super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->chainedMessages).
  super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chainedMessages).
  super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::push_back
            (&this->arguments,&local_28);
  return;
}

Assistant:

MessageSendNode::MessageSendNode(const std::string &selector, Node *receiver, Node *firstArgument)
	: selector(selector), receiver(receiver)
{
	arguments.push_back(firstArgument);
}